

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Node::BeginChildren(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  undefined7 in_register_00000011;
  ostringstream ss;
  string local_1a8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  if ((int)CONCAT71(in_register_00000011,binary) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188," {",2);
    std::__cxx11::stringbuf::str();
    StreamWriter<false,_false>::PutString(s,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
  }
  return;
}

Assistant:

void FBX::Node::BeginChildren(
    Assimp::StreamWriterLE &s,
    bool binary, int indent
) {
    if (binary) {
        // nothing to do
    } else {
        std::ostringstream ss;
        BeginChildrenAscii(ss, indent);
        s.PutString(ss.str());
    }
}